

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.hpp
# Opt level: O0

void __thiscall Movegen::generate<(Movetype)16,(Piece)0>(Movegen *this)

{
  int local_28;
  int local_24;
  int d2;
  int d1;
  U64 caps_r;
  U64 caps_l;
  Movegen *this_local;
  
  caps_r = 0;
  _d2 = 0;
  local_24 = 9;
  if (this->us == white) {
    local_24 = -7;
  }
  local_28 = 7;
  if (this->us == white) {
    local_28 = -9;
  }
  caps_l = (U64)this;
  capture_promotions(this,(U64 *)&d2,&caps_r);
  if (_d2 != 0) {
    encode_capture_promotions(this,(U64 *)&d2,&local_24);
  }
  if (caps_r != 0) {
    encode_capture_promotions(this,&caps_r,&local_28);
  }
  return;
}

Assistant:

inline void Movegen::generate<capture_promotion, pawn>() {
	U64 caps_l = 0;
	U64 caps_r = 0;
	int d1 = (us == white ? -7 : 9);
	int d2 = (us == white ? -9 : 7);
	capture_promotions(caps_r, caps_l);
	if (caps_r != 0ULL) encode_capture_promotions(caps_r, d1);
	if (caps_l != 0ULL) encode_capture_promotions(caps_l, d2);
}